

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdObjSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  UnsignedType UVar1;
  Var value;
  DWORD DVar2;
  
  UVar1 = (playout->super_OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).SlotIndex
  ;
  DVar2 = DynamicObject::GetOffsetOfAuxSlots();
  value = *(Var *)(*(long *)((long)instance + (ulong)DVar2) + (long)(int)UVar1 * 8);
  ProfilingHelpers::ProfileLdSlot(value,*(FunctionBody **)(this + 0x88),playout->profileId);
  return value;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledLdObjSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdObjSlot(instance, playout->SlotIndex);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }